

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

bool nite::keyboardPressOnce(uint key)

{
  bool b;
  uint key_local;
  
  if (key < 100) {
    b = (bool)(KeysCheck[key] & 1);
    KeysState[key] = false;
    KeysStatePressed[key] = false;
    isKeysStatePressed[key] = false;
    KeysCheck[key] = false;
  }
  else {
    b = false;
  }
  return b;
}

Assistant:

bool nite::keyboardPressOnce(unsigned key){
	if (key >= niteKeysn-1) return 0;
	bool b = KeysCheck[key];
	KeysState[key] = 0;
	KeysStatePressed[key] = 0;
	isKeysStatePressed[key] = 0;
	KeysCheck[key] = 0;
	return b;
}